

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O3

void __thiscall dg::vr::GraphBuilder::build(GraphBuilder *this)

{
  long lVar1;
  long lVar2;
  char cVar3;
  Function *function;
  
  lVar1 = *(long *)this;
  for (lVar2 = *(long *)(lVar1 + 0x20); lVar2 != lVar1 + 0x18; lVar2 = *(long *)(lVar2 + 8)) {
    function = (Function *)(lVar2 + -0x38);
    if (lVar2 == 0) {
      function = (Function *)0x0;
    }
    cVar3 = llvm::GlobalValue::isDeclaration();
    if (cVar3 == '\0') {
      buildBlocks(this,function);
      buildTerminators(this,function);
    }
  }
  return;
}

Assistant:

void GraphBuilder::build() {
    for (const llvm::Function &function : module) {
        if (function.isDeclaration())
            continue;

        buildBlocks(function);
        buildTerminators(function);
    }
}